

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
slang::driver::Driver::processCommandFiles
          (Driver *this,string_view pattern,bool makeRelative,bool separateUnit)

{
  error_code ec_00;
  string_view argList;
  string_view fmt;
  string_view text;
  const_iterator pos_;
  bool bVar1;
  pointer __str;
  size_type __len;
  byte in_CL;
  undefined8 in_RDX;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_RSI;
  long in_RDI;
  byte in_R8B;
  error_code eVar2;
  ParseOptions parseOpts;
  bool result;
  string_view argStr;
  error_code ec;
  path currPath;
  error_code readEc;
  SmallVector<char,_40UL> buffer;
  path *path;
  iterator __end2;
  iterator __begin2;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *__range2;
  error_code globEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  anon_class_8_1_8991fb9c onError;
  locator loc;
  size_t pos0;
  size_t hash;
  path *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  iterator it;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  path *x;
  table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  *in_stack_fffffffffffff8f0;
  path *in_stack_fffffffffffff8f8;
  RootSymbol *in_stack_fffffffffffff900;
  pointer in_stack_fffffffffffff908;
  RootSymbol *in_stack_fffffffffffff910;
  string *in_stack_fffffffffffff938;
  _Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff950;
  uint in_stack_fffffffffffff954;
  _Head_base<0UL,_slang::ast::RootSymbol_*,_false> in_stack_fffffffffffff958;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffff960;
  Segment *in_stack_fffffffffffff968;
  _Head_base<0UL,_slang::ast::RootSymbol_*,_false> in_stack_fffffffffffff970;
  RootSymbol *pRVar3;
  _Head_base<0UL,_slang::ast::RootSymbol_*,_false> in_stack_fffffffffffff978;
  Driver *in_stack_fffffffffffff998;
  Driver *in_stack_fffffffffffff9a0;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  equal_to<std::filesystem::__cxx11::path> *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  path *in_stack_fffffffffffffa00;
  ParseOptions local_59c;
  size_t local_598;
  char *pcStack_590;
  bool local_579;
  basic_string_view<char,_std::char_traits<char>_> local_578;
  path local_568;
  undefined1 local_540 [56];
  path local_508;
  group_type_pointer local_4e0;
  value_type_pointer local_4d8;
  format_args in_stack_fffffffffffffb50;
  bool in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb61;
  pointer in_stack_fffffffffffffb68;
  error_code local_480;
  SmallVectorBase<char> local_470 [2];
  __uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  local_430;
  Driver *local_428;
  Driver *local_420;
  Type *local_418;
  uint local_40c;
  undefined1 in_stack_fffffffffffffc17;
  Type *in_stack_fffffffffffffc28;
  string_view in_stack_fffffffffffffc30;
  _Alloc_hider in_stack_fffffffffffffc50;
  Type local_3a0;
  byte local_32a;
  byte local_329;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *local_320;
  GlobMode GStack_314;
  byte local_309;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
  local_308;
  Driver *in_stack_fffffffffffffd30;
  group_type_pointer in_stack_fffffffffffffd38;
  value_type_pointer in_stack_fffffffffffffd40;
  bool local_269 [25];
  iterator local_250;
  bool local_239 [25];
  iterator local_220;
  bool local_209;
  iterator local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
  local_1f8;
  size_t local_1e0;
  size_t local_1d8;
  path *local_1d0;
  Driver *local_1c8;
  group_type_pointer local_1c0;
  uint local_1b4;
  value_type *local_1b0;
  value_type *local_1a8;
  uint local_19c;
  group_type *local_198;
  group_type_pointer local_190;
  pow2_quadratic_prober local_188;
  size_t local_178;
  size_t local_170;
  path *local_168;
  group_type_pointer local_160;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
  local_158;
  tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  local_118;
  RootSymbol *local_110;
  ulong local_108;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
  local_100;
  tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  local_e8;
  RootSymbol *local_e0;
  iterator local_d8;
  ScopedNameSyntax *local_c8;
  table_element_pointer ppStack_c0;
  RootSymbol *local_b0;
  path local_a8;
  unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> local_80;
  uint local_74;
  value_type *local_70;
  value_type *local_68;
  uint local_5c;
  group_type *local_58;
  Segment *local_50;
  pow2_quadratic_prober local_48;
  byte *local_38;
  Segment *local_30;
  _Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  local_28;
  RootSymbol *local_20;
  table_element_type *local_18;
  pointer local_10;
  RootSymbol *local_8;
  
  GStack_314 = (GlobMode)((ulong)in_RDX >> 0x20);
  local_329 = in_CL & 1;
  local_32a = in_R8B & 1;
  local_320 = in_RSI;
  SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1c7832);
  x = (path *)&stack0xfffffffffffffc50;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff8f0);
  std::filesystem::__cxx11::path::path((path *)in_stack_fffffffffffff8f0);
  svGlob((path *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,GStack_314,local_320,
         (bool)in_stack_fffffffffffffc17,(error_code *)in_stack_fffffffffffffc50._M_p);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8f0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xfffffffffffffc50);
  if (bVar1) {
    eVar2._M_cat = (error_category *)in_stack_fffffffffffff978._M_head_impl;
    eVar2._0_8_ = in_stack_fffffffffffff970._M_head_impl;
    local_309 = processCommandFiles(std::basic_string_view<char,std::char_traits<char>>,bool,bool)::
                $_0::operator()((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff968,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffff960._M_head_impl,eVar2);
    local_40c = 1;
  }
  else {
    local_418 = &local_3a0;
    local_420 = (Driver *)
                SmallVectorBase<std::filesystem::__cxx11::path>::begin
                          ((SmallVectorBase<std::filesystem::__cxx11::path> *)local_418);
    local_428 = (Driver *)
                SmallVectorBase<std::filesystem::__cxx11::path>::end
                          ((SmallVectorBase<std::filesystem::__cxx11::path> *)local_418);
    for (; local_420 != local_428;
        local_420 = (Driver *)((long)&(local_420->defaultComp).options + 0x18)) {
      local_430._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )local_420;
      SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x1c79db);
      eVar2 = OS::readFile(in_stack_fffffffffffffa00,
                           (SmallVector<char,_40UL> *)
                           CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
      local_480._M_cat = eVar2._M_cat;
      local_480._M_value = eVar2._M_value;
      bVar1 = std::error_code::operator_cast_to_bool(&local_480);
      if (bVar1) {
        in_stack_fffffffffffffa00 = (path *)getU8Str((path *)0x1c7a42);
        in_stack_fffffffffffffb68 = (pointer)CONCAT44(local_480._4_4_,local_480._M_value);
        ec_00._M_cat = (error_category *)in_stack_fffffffffffff978._M_head_impl;
        ec_00._0_8_ = in_stack_fffffffffffff970._M_head_impl;
        in_stack_fffffffffffff9ff =
             processCommandFiles(std::basic_string_view<char,std::char_traits<char>>,bool,bool)::$_0
             ::operator()((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff968,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff960._M_head_impl,ec_00);
        local_40c = 1;
        local_309 = in_stack_fffffffffffff9ff;
      }
      else {
        local_1c8 = (Driver *)
                    local_430._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl;
        local_1c0 = (group_type_pointer)(in_RDI + 0x1480);
        local_1d0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                    ::key_from<std::filesystem::__cxx11::path>((path *)0x1c7b46);
        local_1d8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                    ::hash_for<std::filesystem::__cxx11::path>(in_stack_fffffffffffff8f0,x);
        local_1e0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                    ::position_for(in_stack_fffffffffffff8f0,(size_t)x);
        local_168 = local_1d0;
        local_178 = local_1d8;
        local_170 = local_1e0;
        local_160 = (group_type_pointer)(in_RDI + 0x1480);
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_188,local_1e0);
        do {
          local_190 = (group_type_pointer)
                      boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_188);
          local_198 = boost::unordered::detail::foa::
                      table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                      ::groups((table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                                *)0x1c7c45);
          local_198 = local_198 + (long)local_190;
          local_19c = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff8f8,(size_t)in_stack_fffffffffffff8f0);
          if (local_19c != 0) {
            local_1a8 = boost::unordered::detail::foa::
                        table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                        ::elements((table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                                    *)0x1c7ca3);
            local_1b0 = local_1a8 + (long)local_190 * 0xf;
            do {
              local_1b4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffff9b0 =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                           *)0x1c7cf6);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
              ::key_from<std::filesystem::__cxx11::path>((path *)0x1c7d2a);
              bVar1 = std::equal_to<std::filesystem::__cxx11::path>::operator()
                                ((equal_to<std::filesystem::__cxx11::path> *)
                                 in_stack_fffffffffffff8f0,x,(path *)0x1c7d51);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
                ::table_locator(&local_1f8,local_198,local_1b4,local_1b0 + local_1b4);
                goto LAB_001c7e46;
              }
              local_19c = local_19c - 1 & local_19c;
            } while (local_19c != 0);
          }
          in_stack_fffffffffffff9af =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff8f0,(size_t)x);
          if ((bool)in_stack_fffffffffffff9af) {
            memset(&local_1f8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
            ::table_locator(&local_1f8);
            goto LAB_001c7e46;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_188,*(size_t *)(in_RDI + 0x1488));
        } while (bVar1);
        memset(&local_1f8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
        ::table_locator(&local_1f8);
LAB_001c7e46:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_1f8);
        if (bVar1) {
          local_208 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      ::make_iterator((locator *)0x1c7e68);
          local_209 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                      *)&stack0xfffffffffffffb50,&local_208,&local_209);
        }
        else if (*(ulong *)(in_RDI + 0x14a8) < *(ulong *)(in_RDI + 0x14a0)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::unchecked_emplace_at<std::filesystem::__cxx11::path_const&>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908,
                     (size_t)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
          local_220 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      ::make_iterator((locator *)0x1c7ef0);
          local_239[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                      *)&stack0xfffffffffffffb50,&local_220,local_239);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::unchecked_emplace_with_rehash<std::filesystem::__cxx11::path_const&>
                    ((table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)in_stack_fffffffffffff960._M_head_impl,
                     (size_t)in_stack_fffffffffffff958._M_head_impl,
                     (path *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
          local_250 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      ::make_iterator((locator *)0x1c7f5b);
          local_269[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                      *)&stack0xfffffffffffffb50,&local_250,local_269);
        }
        if (((in_stack_fffffffffffffb60 ^ 0xffU) & 1) == 0) {
          std::filesystem::__cxx11::path::path((path *)in_stack_fffffffffffff8f0);
          std::error_code::error_code((error_code *)in_stack_fffffffffffff8f0);
          if ((local_329 & 1) != 0) {
            std::filesystem::current_path_abi_cxx11_((error_code *)local_540);
            in_stack_fffffffffffff998 = (Driver *)local_540;
            std::filesystem::__cxx11::path::operator=
                      (in_stack_fffffffffffff8f8,(path *)in_stack_fffffffffffff8f0);
            std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8f0);
            std::filesystem::__cxx11::path::parent_path();
            std::filesystem::current_path(&local_568,(error_code *)(local_540 + 0x28));
            std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8f0);
          }
          SmallVectorBase<char>::pop_back((SmallVectorBase<char> *)in_stack_fffffffffffff8f0);
          __str = SmallVectorBase<char>::data(local_470);
          __len = SmallVectorBase<char>::size(local_470);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_578,__str,__len);
          if ((local_32a & 1) == 0) {
            CommandLine::ParseOptions::ParseOptions(&local_59c);
            local_59c.supportComments = true;
            local_59c.ignoreProgramName = true;
            local_59c.expandEnvVars = true;
            local_59c.ignoreDuplicates = true;
            argList._M_len._7_1_ = in_stack_fffffffffffff9af;
            argList._M_len._0_7_ = in_stack_fffffffffffff9a8;
            argList._M_str = (char *)in_stack_fffffffffffff9b0;
            local_579 = parseCommandLine(in_stack_fffffffffffff998,argList,
                                         SUB84((ulong)in_stack_fffffffffffff9a0 >> 0x20,0));
          }
          else {
            local_598 = local_578._M_len;
            pcStack_590 = local_578._M_str;
            text._M_str = (char *)in_stack_fffffffffffffd40;
            text._M_len = (size_t)in_stack_fffffffffffffd38;
            local_579 = parseUnitListing(in_stack_fffffffffffffd30,text);
          }
          if ((local_329 & 1) != 0) {
            std::filesystem::current_path(&local_508,(error_code *)(local_540 + 0x28));
          }
          in_stack_fffffffffffff970._M_head_impl = (RootSymbol *)(in_RDI + 0x1480);
          local_118.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    )local_430._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl;
          local_e8.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    )local_430._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl;
          local_a8._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    )local_430._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl;
          in_stack_fffffffffffff958._M_head_impl = in_stack_fffffffffffff970._M_head_impl;
          local_110 = in_stack_fffffffffffff970._M_head_impl;
          local_e0 = in_stack_fffffffffffff970._M_head_impl;
          local_80._M_t.
          super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
          ._M_t.
          super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
          .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl =
               (__uniq_ptr_data<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>,_true,_true>
                )(__uniq_ptr_data<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>,_true,_true>
                  )in_stack_fffffffffffff970._M_head_impl;
          local_a8._M_pathname.field_2._8_8_ =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
               ::hash_for<std::filesystem::__cxx11::path>(in_stack_fffffffffffff8f0,x);
          in_stack_fffffffffffff960._M_head_impl =
               (_Impl *)local_a8._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
          in_stack_fffffffffffff968 =
               (Segment *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
               ::position_for(in_stack_fffffffffffff8f0,(size_t)x);
          local_38 = (byte *)local_a8._M_pathname.field_2._8_8_;
          in_stack_fffffffffffff978._M_head_impl = in_stack_fffffffffffff958._M_head_impl;
          local_30 = in_stack_fffffffffffff968;
          local_28.super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
          _M_head_impl = (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)
                         (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)
                         in_stack_fffffffffffff960._M_head_impl;
          local_20 = in_stack_fffffffffffff958._M_head_impl;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_48,(size_t)in_stack_fffffffffffff968);
          do {
            local_50 = (Segment *)
                       boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_48);
            local_58 = boost::unordered::detail::foa::
                       table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                       ::groups((table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                                 *)0x1c84a5);
            local_58 = local_58 + (long)local_50;
            in_stack_fffffffffffff954 =
                 boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff8f8,(size_t)in_stack_fffffffffffff8f0);
            local_5c = in_stack_fffffffffffff954;
            if (in_stack_fffffffffffff954 != 0) {
              local_68 = boost::unordered::detail::foa::
                         table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                         ::elements((table_arrays<std::filesystem::__cxx11::path,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::filesystem::__cxx11::path>_>
                                     *)0x1c84fa);
              local_70 = local_68 + (long)local_50 * 0xf;
              do {
                local_74 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                in_stack_fffffffffffff938 =
                     (string *)
                     boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                             *)0x1c854a);
                in_stack_fffffffffffff940.
                super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl = (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                )(_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  )local_28;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                ::key_from<std::filesystem::__cxx11::path>((path *)0x1c8578);
                bVar1 = std::equal_to<std::filesystem::__cxx11::path>::operator()
                                  ((equal_to<std::filesystem::__cxx11::path> *)
                                   in_stack_fffffffffffff8f0,x,(path *)0x1c8593);
                if (bVar1) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
                  ::table_locator(&local_100,local_58,local_74,local_70 + local_74);
                  goto LAB_001c867f;
                }
                local_5c = local_5c - 1 & local_5c;
              } while (local_5c != 0);
            }
            bVar1 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff8f0,(size_t)x);
            if (bVar1) {
              memset(&local_100,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
              ::table_locator(&local_100);
              goto LAB_001c867f;
            }
            bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_48,
                               ((in_stack_fffffffffffff958._M_head_impl)->super_Symbol).name._M_len)
            ;
          } while (bVar1);
          memset(&local_100,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::filesystem::__cxx11::path>
          ::table_locator(&local_100);
LAB_001c867f:
          local_d8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     ::make_iterator((locator *)0x1c868e);
          local_158.second.
          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
          .
          super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
          .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>._M_head_impl =
               (ScopedNameSyntax *)local_d8.pc_;
          local_158.second.
          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
          .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl =
               (SyntaxNode *)local_d8.p_;
          local_158._32_16_ =
               boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
               ::end((table<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)0x1c86df);
          bVar1 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_fffffffffffff8f0,
                             (table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)x);
          if (bVar1) {
            local_158.first.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .
            super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_str =
                 (char *)local_158.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                         .
                         super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                         .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>.
                         _M_head_impl;
            local_158.first.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len =
                 (size_t)local_158.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                         .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                         _M_head_impl;
            local_a8._M_pathname.field_2._M_allocated_capacity = (size_type)&local_158;
            local_a8._M_pathname._M_dataplus._M_p =
                 (pointer)local_158.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                          .
                          super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                          .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>.
                          _M_head_impl;
            local_a8._M_pathname._M_string_length =
                 (size_type)
                 local_158.second.
                 super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl;
            in_stack_fffffffffffff8f8 = &local_a8;
            pRVar3 = in_stack_fffffffffffff970._M_head_impl;
            local_b0 = in_stack_fffffffffffff970._M_head_impl;
            in_stack_fffffffffffff908 =
                 (pointer)boost::unordered::detail::foa::
                          table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          ::pc((table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                *)0x1c8786);
            local_18 = boost::unordered::detail::foa::
                       table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       ::p((table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)0x1c8795);
            in_stack_fffffffffffff910 = in_stack_fffffffffffff970._M_head_impl;
            local_10 = in_stack_fffffffffffff908;
            local_8 = in_stack_fffffffffffff970._M_head_impl;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            ::destroy_element(in_stack_fffffffffffff8f0,x);
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            ::recover_slot(in_stack_fffffffffffff8f0,(uchar *)x);
            local_c8 = (ScopedNameSyntax *)local_a8._M_pathname._M_dataplus._M_p;
            ppStack_c0 = (table_element_pointer)local_a8._M_pathname._M_string_length;
            pos_.p_ = (table_element_pointer)local_a8._M_pathname._M_string_length;
            pos_.pc_ = (char_pointer)local_a8._M_pathname._M_dataplus._M_p;
            boost::unordered::detail::foa::
            table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
            ::table_erase_return_type
                      ((table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
                        *)&local_158,pos_);
            in_stack_fffffffffffff900 = in_stack_fffffffffffff970._M_head_impl;
            in_stack_fffffffffffff970._M_head_impl = pRVar3;
          }
          local_108 = (ulong)bVar1;
          bVar1 = (local_579 & 1U) == 0;
          if (bVar1) {
            *(undefined1 *)(in_RDI + 0x1478) = 1;
            local_309 = 0;
          }
          local_40c = (uint)bVar1;
          std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8f0);
        }
        else {
          local_4e0 = (group_type_pointer)0xad5956;
          local_4d8 = (value_type_pointer)0x2d;
          in_stack_fffffffffffff9a0 = (Driver *)getU8Str((path *)0x1c7fd0);
          local_308.second.first.
          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_4e0;
          local_308.second.first.
          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_4d8;
          in_stack_fffffffffffffd30 = in_stack_fffffffffffff9a0;
          in_stack_fffffffffffffd38 = local_4e0;
          in_stack_fffffffffffffd40 = local_4d8;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff900,
                     &in_stack_fffffffffffff8f8->_M_pathname);
          local_308.second.first.
          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_308;
          local_308.first.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str = (char *)0xd;
          fmt.data_._1_7_ = in_stack_fffffffffffffb61;
          fmt.data_._0_1_ = in_stack_fffffffffffffb60;
          fmt.size_ = (size_t)in_stack_fffffffffffffb68;
          ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_fffffffffffffb50);
          printError((Driver *)
                     in_stack_fffffffffffff940.
                     super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl,in_stack_fffffffffffff938);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8f0);
          *(undefined1 *)(in_RDI + 0x1478) = 1;
          local_309 = 0;
          local_40c = 1;
        }
      }
      SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x1c8893);
      if (local_40c != 0) goto LAB_001c88dd;
    }
    local_309 = 1;
    local_40c = 1;
  }
LAB_001c88dd:
  SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1c88ea);
  return (bool)(local_309 & 1);
}

Assistant:

bool Driver::processCommandFiles(std::string_view pattern, bool makeRelative, bool separateUnit) {
    auto onError = [this](const auto& name, std::error_code ec) {
        printError(fmt::format("command file '{}': {}", name, ec.message()));
        anyFailedLoads = true;
        return false;
    };

    SmallVector<fs::path> files;
    std::error_code globEc;
    svGlob({}, pattern, GlobMode::Files, files, /* expandEnvVars */ false, globEc);
    if (globEc)
        return onError(pattern, globEc);

    for (auto& path : files) {
        SmallVector<char> buffer;
        if (auto readEc = OS::readFile(path, buffer))
            return onError(getU8Str(path), readEc);

        if (!activeCommandFiles.insert(path).second) {
            printError(
                fmt::format("command file '{}' includes itself recursively", getU8Str(path)));
            anyFailedLoads = true;
            return false;
        }

        fs::path currPath;
        std::error_code ec;
        if (makeRelative) {
            currPath = fs::current_path(ec);
            fs::current_path(path.parent_path(), ec);
        }

        SLANG_ASSERT(!buffer.empty());
        buffer.pop_back();
        std::string_view argStr(buffer.data(), buffer.size());

        bool result;
        if (separateUnit) {
            result = parseUnitListing(argStr);
        }
        else {
            CommandLine::ParseOptions parseOpts;
            parseOpts.expandEnvVars = true;
            parseOpts.ignoreProgramName = true;
            parseOpts.supportComments = true;
            parseOpts.ignoreDuplicates = true;
            result = parseCommandLine(argStr, parseOpts);
        }

        if (makeRelative)
            fs::current_path(currPath, ec);

        activeCommandFiles.erase(path);

        if (!result) {
            anyFailedLoads = true;
            return false;
        }
    }

    return true;
}